

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O1

int32_t __thiscall
icu_63::UCharsTrieBuilder::getLimitOfLinearMatch
          (UCharsTrieBuilder *this,int32_t first,int32_t last,int32_t unitIndex)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  char16_t cVar6;
  char16_t cVar7;
  char16_t *pcVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  
  uVar2 = this->elements[first].stringOffset;
  uVar1 = (this->strings).fUnion.fStackFields.fLengthAndFlags;
  if ((short)uVar1 < 0) {
    uVar9 = *(uint *)((long)&(this->strings).fUnion + 4);
  }
  else {
    uVar9 = (int)(short)uVar1 >> 5;
  }
  uVar11 = 0xffff;
  if (uVar2 < uVar9) {
    if ((uVar1 & 2) == 0) {
      pcVar8 = (this->strings).fUnion.fFields.fArray;
    }
    else {
      pcVar8 = (char16_t *)((long)&(this->strings).fUnion + 2);
    }
    uVar11 = (ulong)(ushort)pcVar8[(int)uVar2];
  }
  if ((uVar1 & 2) == 0) {
    pcVar8 = (this->strings).fUnion.fFields.fArray;
  }
  else {
    pcVar8 = (char16_t *)((long)&(this->strings).fUnion + 2);
  }
  lVar5 = (long)unitIndex;
  iVar4 = unitIndex + 1;
  if (unitIndex + 1 < (int)uVar11) {
    iVar4 = (int)uVar11;
  }
  iVar3 = unitIndex + 2;
  do {
    iVar10 = iVar3;
    lVar5 = lVar5 + 1;
    if ((long)uVar11 <= lVar5) {
      return iVar4;
    }
    cVar6 = L'\xffff';
    cVar7 = L'\xffff';
    if (uVar2 + iVar10 < uVar9) {
      cVar7 = pcVar8[(int)(uVar2 + iVar10)];
    }
    uVar12 = this->elements[last].stringOffset + iVar10;
    if (uVar12 < uVar9) {
      cVar6 = pcVar8[(int)uVar12];
    }
    iVar3 = iVar10 + 1;
  } while (cVar7 == cVar6);
  return iVar10 + -1;
}

Assistant:

int32_t
UCharsTrieBuilder::getLimitOfLinearMatch(int32_t first, int32_t last, int32_t unitIndex) const {
    const UCharsTrieElement &firstElement=elements[first];
    const UCharsTrieElement &lastElement=elements[last];
    int32_t minStringLength=firstElement.getStringLength(strings);
    while(++unitIndex<minStringLength &&
            firstElement.charAt(unitIndex, strings)==
            lastElement.charAt(unitIndex, strings)) {}
    return unitIndex;
}